

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

ParseResult * toml::parse(ParseResult *__return_storage_ptr__,istream *is)

{
  Value *this;
  string *er;
  Value v;
  Parser parser;
  undefined1 local_128 [24];
  _Alloc_hider local_110;
  Value local_108;
  string local_f8;
  Value local_d8;
  string local_c8;
  undefined1 local_a8 [112];
  string local_38;
  
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    internal::Parser::Parser((Parser *)local_a8,is);
    internal::Parser::parse((Parser *)local_128);
    if (local_128._0_4_ == NULL_TYPE) {
      this = &local_108;
      Value::Value(this,(Value *)local_128);
      er = &local_38;
      std::__cxx11::string::string((string *)er,(string *)(local_a8 + 0x50));
    }
    else {
      this = &local_d8;
      Value::Value(this,(Value *)local_128);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      er = &local_f8;
    }
    ParseResult::ParseResult(__return_storage_ptr__,this,er);
    std::__cxx11::string::~string((string *)er);
    Value::~Value(this);
    Value::~Value((Value *)local_128);
    internal::Parser::~Parser((Parser *)local_a8);
  }
  else {
    local_128._16_4_ = ERROR_TOKEN;
    local_110._M_p = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)&local_c8,"stream is in bad state. file does not exist?",
               (allocator *)local_a8);
    ParseResult::ParseResult(__return_storage_ptr__,(Value *)(local_128 + 0x10),&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    Value::~Value((Value *)(local_128 + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult parse(std::istream& is)
{
    if (!is) {
        return ParseResult(toml::Value(), "stream is in bad state. file does not exist?");
    }

    internal::Parser parser(is);
    toml::Value v = parser.parse();

    if (v.valid())
        return ParseResult(std::move(v), std::string());

    return ParseResult(std::move(v), std::move(parser.errorReason()));
}